

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O1

int __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::remove(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
         *this,char *__filename)

{
  float *pfVar1;
  Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
  *this_00;
  long *plVar2;
  long lVar3;
  Node **ppNVar4;
  default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>
  *this_01;
  uint uVar5;
  int iVar6;
  long lVar7;
  Node *in_RDX;
  Node *extraout_RDX;
  Node *value;
  array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
  *__range2;
  iterator __position;
  Node **value_1;
  Node **__args;
  byte bVar8;
  undefined8 unaff_R14;
  iterator __end0;
  bool bVar9;
  Box<float> local_48;
  int local_34;
  
  lVar7._0_4_ = (this->mBox).left;
  lVar7._4_4_ = (this->mBox).top;
  value = in_RDX;
  if (lVar7 != 0) {
    local_48 = *(Box<float> *)
                (in_RDX->children)._M_elems[0]._M_t.
                super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                ._M_t.
                super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                .
                super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
    ;
    uVar5 = getQuadrant((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                         *)__filename,&local_48,(Box<float> *)in_RDX);
    value = extraout_RDX;
    if (uVar5 != 0xffffffff) {
      this_00 = *(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                  **)(&(this->mBox).left + (ulong)uVar5 * 2);
      local_48 = computeBox((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                             *)__filename,(Box<float> *)(ulong)uVar5,(int)extraout_RDX);
      iVar6 = remove(this_00,(char *)&local_48);
      if ((char)iVar6 == '\0') {
        return 0;
      }
      __position._M_current = (Node **)(*(long *)&this[1].mBox.width - *(long *)&this[1].mBox >> 3);
      bVar9 = false;
      lVar7 = 0;
      do {
        plVar2 = *(long **)((long)&(this->mBox).left + lVar7);
        if (*plVar2 != 0) break;
        __position._M_current =
             (Node **)((long)&(((Node *)__position._M_current)->children)._M_elems[0]._M_t.
                              super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                              .
                              super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
                      + (plVar2[5] - plVar2[4] >> 3));
        lVar7 = lVar7 + 8;
        bVar9 = lVar7 == 0x20;
      } while (!bVar9);
      bVar8 = __position._M_current < (Node *)0x11 & bVar9;
      local_34 = (int)CONCAT71((int7)((ulong)this_00 >> 8),bVar8);
      if (bVar8 != 1) {
        return local_34;
      }
      std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                ((vector<Node_*,_std::allocator<Node_*>_> *)(this + 1),
                 (size_type)__position._M_current);
      lVar7 = 0;
      do {
        lVar3 = *(long *)((long)&(this->mBox).left + lVar7);
        ppNVar4 = *(Node ***)(lVar3 + 0x28);
        for (__args = *(Node ***)(lVar3 + 0x20); __args != ppNVar4; __args = __args + 1) {
          __position._M_current = *(Node ***)&this[1].mBox.width;
          if ((Node *)__position._M_current ==
              this[1].mRoot._M_t.
              super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
              ._M_t.
              super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
              .
              super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
              ._M_head_impl) {
            std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                      ((vector<Node*,std::allocator<Node*>> *)(this + 1),__position,__args);
          }
          else {
            *__position._M_current = *__args;
            pfVar1 = &this[1].mBox.width;
            *(long *)pfVar1 = *(long *)pfVar1 + 8;
          }
        }
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x20);
      lVar7 = 0;
      do {
        this_01 = *(default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>
                    **)((long)&(this->mBox).left + lVar7);
        *(undefined8 *)((long)&(this->mBox).left + lVar7) = 0;
        if (this_01 !=
            (default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>
             *)0x0) {
          std::
          default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>
          ::operator()(this_01,(Node *)__position._M_current);
        }
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x20);
      return local_34;
    }
  }
  removeValue(this,in_RDX,(Node **)value);
  return (int)CONCAT71((int7)((ulong)unaff_R14 >> 8),lVar7 == 0);
}

Assistant:

bool remove(Node* node, const Box<Float>& box, const T& value)
    {
        assert(node != nullptr);
        assert(box.contains(mGetBox(value)));
        if (isLeaf(node))
        {
            // Remove the value from node
            removeValue(node, value);
            return true;
        }
        else
        {
            // Remove the value in a child if the value is entirely contained in it
            auto i = getQuadrant(box, mGetBox(value));
            if (i != -1)
            {
                if (remove(node->children[static_cast<std::size_t>(i)].get(), computeBox(box, i), value))
                    return tryMerge(node);
            }
            // Otherwise, we remove the value from the current node
            else
                removeValue(node, value);
            return false;
        }
    }